

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_24fa3d::OSScapture::~OSScapture(OSScapture *this)

{
  ~OSScapture(this);
  al_free(this);
  return;
}

Assistant:

OSScapture::~OSScapture()
{
    if(mFd != -1)
        close(mFd);
    mFd = -1;
}